

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

void tree_sitter_c_sharp_external_scanner_deserialize(void *payload,char *buffer,uint length)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  void *pvVar4;
  uint uVar5;
  uint i;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  *(undefined1 *)payload = 0;
  *(undefined4 *)((long)payload + 0x10) = 0;
  if (length == 0) {
    uVar5 = 0;
  }
  else {
    *(char *)payload = *buffer;
    bVar1 = buffer[1];
    *(uint *)((long)payload + 0x10) = (uint)bVar1;
    _array__reserve((Array *)((long)payload + 8),(ulong)bVar1,length);
    uVar5 = 2;
    for (uVar6 = 0; uVar6 < *(uint *)((long)payload + 0x10); uVar6 = uVar6 + 1) {
      uVar7 = (ulong)uVar5;
      cVar2 = buffer[uVar5 + 1];
      uVar8 = uVar5 + 3;
      cVar3 = buffer[uVar5 + 2];
      uVar5 = uVar5 + 4;
      bVar1 = buffer[uVar8];
      pvVar4 = ((Array *)((long)payload + 8))->contents;
      *(char *)((long)pvVar4 + uVar6 * 8) = buffer[uVar7];
      *(char *)((long)pvVar4 + uVar6 * 8 + 1) = cVar2;
      *(char *)((long)pvVar4 + uVar6 * 8 + 2) = cVar3;
      *(undefined1 *)((long)pvVar4 + uVar6 * 8 + 3) = 0;
      *(uint *)((long)pvVar4 + uVar6 * 8 + 4) = (uint)bVar1;
    }
  }
  if (uVar5 == length) {
    return;
  }
  __assert_fail("size == length",
                "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-c-sharp/src/scanner.c"
                ,0x6b,
                "void tree_sitter_c_sharp_external_scanner_deserialize(void *, const char *, unsigned int)"
               );
}

Assistant:

void tree_sitter_c_sharp_external_scanner_deserialize(void *payload, const char *buffer, unsigned length) {
    Scanner *scanner = (Scanner *)payload;

    scanner->quote_count = 0;
    array_clear(&scanner->interpolation_stack);
    unsigned size = 0;

    if (length > 0) {
        scanner->quote_count = (unsigned char)buffer[size++];
        scanner->interpolation_stack.size = (unsigned char)buffer[size++];
        array_reserve(&scanner->interpolation_stack, scanner->interpolation_stack.size);

        for (unsigned i = 0; i < scanner->interpolation_stack.size; i++) {
            Interpolation interpolation = {0};
            interpolation.dollar_count = buffer[size++];
            interpolation.open_brace_count = buffer[size++];
            interpolation.quote_count = buffer[size++];
            interpolation.string_type = (unsigned char)buffer[size++];
            scanner->interpolation_stack.contents[i] = interpolation;
        }
    }

    assert(size == length);
}